

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# StringStream.hpp
# Opt level: O3

void __thiscall
Qentem::StringStream<char16_t>::StringStream
          (StringStream<char16_t> *this,StringStream<char16_t> *stream)

{
  uint new_capacity;
  SizeT SVar1;
  char16_t *from;
  uint uVar2;
  
  this->storage_ = (char16_t *)0x0;
  this->length_ = 0;
  this->capacity_ = 0;
  if (stream->length_ != 0) {
    allocate(this,stream->length_);
    from = stream->storage_;
    SVar1 = stream->length_;
    uVar2 = this->length_;
    new_capacity = uVar2 + SVar1;
    if (this->capacity_ < new_capacity) {
      expand(this,new_capacity);
      uVar2 = this->length_;
    }
    Memory::Copy<unsigned_int>(this->storage_ + uVar2,from,SVar1 * 2);
    this->length_ = new_capacity;
  }
  return;
}

Assistant:

StringStream(const StringStream &stream) {
        if (stream.Length() != 0) {
            allocate(stream.Length());
            write(stream.First(), stream.Length());
        }
    }